

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_file_write_null_buffer(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  uv_fs_t *__s1;
  char *pcVar3;
  char *pcVar4;
  int in_EDI;
  uv_fs_t *puVar5;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_loop_t **unaff_R15;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  uv_loop_t *puStack_98;
  uint uStack_90;
  char *pcStack_88;
  char *pcStack_80;
  uv_fs_t *puStack_70;
  code *pcStack_68;
  code *pcStack_60;
  uv_loop_t *puStack_58;
  uint uStack_50;
  char *pcStack_48;
  
  fs_file_write_null_buffer(in_EDI);
  fs_file_write_null_buffer(in_EDI);
  uVar2 = uv_default_loop();
  uv_walk(uVar2,close_walk_cb,0);
  uv_run(uVar2,0);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar1 < 0) {
    fs_file_write_null_buffer_cold_1();
LAB_0015c086:
    fs_file_write_null_buffer_cold_2();
LAB_0015c08b:
    fs_file_write_null_buffer_cold_3();
LAB_0015c090:
    fs_file_write_null_buffer_cold_4();
LAB_0015c095:
    fs_file_write_null_buffer_cold_5();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015c086;
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init(0,0);
    iVar1 = uv_fs_write(0,&write_req,(undefined4)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_0015c08b;
    if (write_req.result != 0) goto LAB_0015c090;
    uv_fs_req_cleanup(&write_req);
    iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
    if (iVar1 != 0) goto LAB_0015c095;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      iVar1 = unlink("test_file");
      return iVar1;
    }
  }
  fs_file_write_null_buffer_cold_6();
  pcStack_48 = "test_file";
  pcStack_60 = (code *)0x15c0b8;
  unlink("test_dir/file1");
  pcStack_60 = (code *)0x15c0c4;
  unlink("test_dir/file2");
  pcVar3 = "test_dir";
  pcStack_60 = (code *)0x15c0d3;
  rmdir("test_dir");
  pcStack_60 = (code *)0x15c0d8;
  __s1 = (uv_fs_t *)uv_default_loop();
  pcStack_60 = (code *)0x15c0fd;
  loop = (uv_loop_t *)__s1;
  iVar1 = uv_fs_mkdir(__s1,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    pcStack_60 = (code *)0x15c113;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_0015c520;
    __s1 = (uv_fs_t *)0x0;
    pcStack_60 = (code *)0x15c143;
    iVar1 = uv_fs_open(0,&open_req1,"test_dir/file1",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_0015c525;
    pcStack_60 = (code *)0x15c157;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_60 = (code *)0x15c16d;
    iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
    if (iVar1 != 0) goto LAB_0015c52a;
    pcStack_60 = (code *)0x15c181;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_60 = (code *)0x15c1a4;
    iVar1 = uv_fs_open(0,&open_req1,"test_dir/file2",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_0015c52f;
    pcStack_60 = (code *)0x15c1b8;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_60 = (code *)0x15c1ce;
    iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
    if (iVar1 != 0) goto LAB_0015c534;
    pcStack_60 = (code *)0x15c1e2;
    uv_fs_req_cleanup(&close_req);
    pcStack_60 = (code *)0x15c205;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_scandir(loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar1 != 0) goto LAB_0015c539;
    pcStack_60 = (code *)0x15c21b;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_0015c53e;
    __s1 = (uv_fs_t *)0x0;
    pcStack_60 = (code *)0x15c242;
    iVar1 = uv_fs_scandir(0,&scandir_req,"test_dir",0,0);
    if (iVar1 != 2) goto LAB_0015c543;
    if (scandir_req.result != 2) goto LAB_0015c548;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0015c54d;
    pcStack_60 = (code *)0x15c276;
    iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_58);
    if (iVar1 != -0xfff) {
      pcVar3 = "file1";
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        __s1 = (uv_fs_t *)puStack_58;
        pcVar4 = "file1";
        pcStack_60 = (code *)0x15c2a4;
        iVar1 = strcmp((char *)puStack_58,"file1");
        if (iVar1 != 0) {
          pcVar4 = "file2";
          pcStack_60 = (code *)0x15c2b3;
          iVar1 = strcmp((char *)__s1,"file2");
          if (iVar1 != 0) {
            pcStack_60 = (code *)0x15c51b;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &puStack_58;
            goto LAB_0015c51b;
          }
        }
        dent.name = (char *)(ulong)uStack_50;
        pcStack_60 = (code *)0x15c2c4;
        dent._8_8_ = pcVar4;
        assert_is_file_type(dent);
        pcStack_60 = (code *)0x15c2cf;
        iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_58);
        unaff_R15 = &puStack_58;
      } while (iVar1 != -0xfff);
    }
    __s1 = &scandir_req;
    pcStack_60 = (code *)0x15c2e2;
    uv_fs_req_cleanup();
    if (scandir_req.ptr != (void *)0x0) goto LAB_0015c552;
    pcStack_60 = (code *)0x15c311;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_stat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_0015c557;
    pcStack_60 = (code *)0x15c327;
    uv_run(loop,0);
    pcStack_60 = (code *)0x15c348;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_stat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_0015c55c;
    pcStack_60 = (code *)0x15c35e;
    uv_run(loop,0);
    pcStack_60 = (code *)0x15c37f;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_lstat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_0015c561;
    pcStack_60 = (code *)0x15c395;
    uv_run(loop,0);
    pcStack_60 = (code *)0x15c3b6;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_lstat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_0015c566;
    pcStack_60 = (code *)0x15c3cc;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (stat_cb_count != 4) goto LAB_0015c56b;
    pcStack_60 = (code *)0x15c3fa;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_unlink(loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar1 != 0) goto LAB_0015c570;
    pcStack_60 = (code *)0x15c410;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 1) goto LAB_0015c575;
    pcStack_60 = (code *)0x15c43e;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_unlink(loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar1 != 0) goto LAB_0015c57a;
    pcStack_60 = (code *)0x15c454;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 2) goto LAB_0015c57f;
    pcStack_60 = (code *)0x15c482;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_rmdir(loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar1 != 0) goto LAB_0015c584;
    pcStack_60 = (code *)0x15c498;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (rmdir_cb_count != 1) goto LAB_0015c589;
    pcStack_60 = (code *)0x15c4b1;
    unlink("test_dir/file1");
    pcStack_60 = (code *)0x15c4bd;
    unlink("test_dir/file2");
    pcStack_60 = (code *)0x15c4c9;
    rmdir("test_dir");
    pcStack_60 = (code *)0x15c4ce;
    pcVar3 = (char *)uv_default_loop();
    pcStack_60 = (code *)0x15c4e2;
    uv_walk(pcVar3,close_walk_cb,0);
    pcStack_60 = (code *)0x15c4ec;
    uv_run(pcVar3,0);
    pcStack_60 = (code *)0x15c4f1;
    __s1 = (uv_fs_t *)uv_default_loop();
    pcStack_60 = (code *)0x15c4f9;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      pcStack_60 = (code *)0x15c506;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_0015c51b:
    pcStack_60 = (code *)0x15c520;
    run_test_fs_async_dir_cold_1();
LAB_0015c520:
    pcStack_60 = (code *)0x15c525;
    run_test_fs_async_dir_cold_2();
LAB_0015c525:
    pcStack_60 = (code *)0x15c52a;
    run_test_fs_async_dir_cold_3();
LAB_0015c52a:
    pcStack_60 = (code *)0x15c52f;
    run_test_fs_async_dir_cold_4();
LAB_0015c52f:
    pcStack_60 = (code *)0x15c534;
    run_test_fs_async_dir_cold_5();
LAB_0015c534:
    pcStack_60 = (code *)0x15c539;
    run_test_fs_async_dir_cold_6();
LAB_0015c539:
    pcStack_60 = (code *)0x15c53e;
    run_test_fs_async_dir_cold_7();
LAB_0015c53e:
    pcStack_60 = (code *)0x15c543;
    run_test_fs_async_dir_cold_8();
LAB_0015c543:
    pcStack_60 = (code *)0x15c548;
    run_test_fs_async_dir_cold_9();
LAB_0015c548:
    pcStack_60 = (code *)0x15c54d;
    run_test_fs_async_dir_cold_10();
LAB_0015c54d:
    pcStack_60 = (code *)0x15c552;
    run_test_fs_async_dir_cold_25();
LAB_0015c552:
    pcStack_60 = (code *)0x15c557;
    run_test_fs_async_dir_cold_12();
LAB_0015c557:
    pcStack_60 = (code *)0x15c55c;
    run_test_fs_async_dir_cold_13();
LAB_0015c55c:
    pcStack_60 = (code *)0x15c561;
    run_test_fs_async_dir_cold_14();
LAB_0015c561:
    pcStack_60 = (code *)0x15c566;
    run_test_fs_async_dir_cold_15();
LAB_0015c566:
    pcStack_60 = (code *)0x15c56b;
    run_test_fs_async_dir_cold_16();
LAB_0015c56b:
    pcStack_60 = (code *)0x15c570;
    run_test_fs_async_dir_cold_17();
LAB_0015c570:
    pcStack_60 = (code *)0x15c575;
    run_test_fs_async_dir_cold_18();
LAB_0015c575:
    pcStack_60 = (code *)0x15c57a;
    run_test_fs_async_dir_cold_19();
LAB_0015c57a:
    pcStack_60 = (code *)0x15c57f;
    run_test_fs_async_dir_cold_20();
LAB_0015c57f:
    pcStack_60 = (code *)0x15c584;
    run_test_fs_async_dir_cold_21();
LAB_0015c584:
    pcStack_60 = (code *)0x15c589;
    run_test_fs_async_dir_cold_22();
LAB_0015c589:
    pcStack_60 = (code *)0x15c58e;
    run_test_fs_async_dir_cold_23();
  }
  pcStack_60 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (__s1 == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_0015c5ed;
    if (mkdir_req.result != 0) goto LAB_0015c5f2;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_0015c5f7;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      iVar1 = uv_fs_req_cleanup(&mkdir_req);
      return iVar1;
    }
  }
  else {
    pcStack_68 = (code *)0x15c5ed;
    mkdir_cb_cold_1();
LAB_0015c5ed:
    pcStack_68 = (code *)0x15c5f2;
    mkdir_cb_cold_2();
LAB_0015c5f2:
    pcStack_68 = (code *)0x15c5f7;
    mkdir_cb_cold_3();
LAB_0015c5f7:
    pcStack_68 = (code *)0x15c5fc;
    mkdir_cb_cold_5();
  }
  pcStack_68 = scandir_cb;
  mkdir_cb_cold_4();
  pcStack_88 = pcVar3;
  pcStack_80 = unaff_R12;
  puStack_70 = unaff_R14;
  pcStack_68 = (code *)unaff_R15;
  if (__s1 == &scandir_req) {
    puVar5 = __s1;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0015c708;
    if (scandir_req.result != 2) goto LAB_0015c70d;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0015c712;
    puVar5 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_98);
    __s1 = (uv_fs_t *)puStack_98;
    while (iVar1 != -0xfff) {
      pcVar3 = "file1";
      puStack_98 = (uv_loop_t *)__s1;
      iVar1 = strcmp((char *)__s1,"file1");
      if (iVar1 != 0) {
        pcVar3 = "file2";
        iVar1 = strcmp((char *)__s1,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_0015c703;
        }
      }
      dent_00.name = (char *)(ulong)uStack_90;
      dent_00._8_8_ = pcVar3;
      assert_is_file_type(dent_00);
      puVar5 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_98);
      __s1 = (uv_fs_t *)puStack_98;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_0015c717;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_0015c71c;
    puVar5 = &scandir_req;
    iVar1 = uv_fs_req_cleanup();
    if (scandir_req.ptr == (void *)0x0) {
      return iVar1;
    }
  }
  else {
LAB_0015c703:
    scandir_cb_cold_1();
    puVar5 = __s1;
LAB_0015c708:
    scandir_cb_cold_2();
LAB_0015c70d:
    scandir_cb_cold_3();
LAB_0015c712:
    scandir_cb_cold_8();
LAB_0015c717:
    scandir_cb_cold_7();
LAB_0015c71c:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar5 < 2) {
    return extraout_EAX;
  }
  assert_is_file_type_cold_1();
  if (puVar5 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_0015c784;
    if (stat_req.result != 0) goto LAB_0015c789;
    if (stat_req.ptr == (void *)0x0) goto LAB_0015c78e;
    stat_cb_count = stat_cb_count + 1;
    puVar5 = &stat_req;
    uv_fs_req_cleanup();
    if (stat_req.ptr == (void *)0x0) {
      return extraout_EAX_00;
    }
  }
  else {
    stat_cb_cold_1();
LAB_0015c784:
    stat_cb_cold_2();
LAB_0015c789:
    stat_cb_cold_3();
LAB_0015c78e:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar5 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_0015c7d0;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(&unlink_req);
      return iVar1;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_0015c7d0:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar5 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_0015c834;
    if (rmdir_req.result != 0) goto LAB_0015c839;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        iVar1 = uv_fs_req_cleanup(&rmdir_req);
        return iVar1;
      }
      goto LAB_0015c843;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_0015c834:
    rmdir_cb_cold_2();
LAB_0015c839:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_0015c843:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x10009);
  return 0;
}

Assistant:

TEST_IMPL(fs_file_write_null_buffer) {
  fs_file_write_null_buffer(0);
  fs_file_write_null_buffer(UV_FS_O_FILEMAP);

  MAKE_VALGRIND_HAPPY();
  return 0;
}